

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O2

void __thiscall
soplex::DataArray<soplex::SPxRowId>::DataArray
          (DataArray<soplex::SPxRowId> *this,int p_size,int p_max,Real p_fac)

{
  int iVar1;
  int n;
  
  this->data = (SPxRowId *)0x0;
  iVar1 = 0;
  if (0 < p_size) {
    iVar1 = p_size;
  }
  n = 1;
  if (0 < p_size) {
    n = iVar1;
  }
  this->memFactor = p_fac;
  if (iVar1 < p_max) {
    n = p_max;
  }
  this->thesize = iVar1;
  this->themax = n;
  spx_alloc<soplex::SPxRowId*>(&this->data,n);
  return;
}

Assistant:

explicit DataArray(int p_size = 0, int p_max = 0, Real p_fac = 1.2)
      : data(nullptr)
      , memFactor(p_fac)
   {
      thesize = (p_size < 0) ? 0 : p_size;

      if(p_max > thesize)
         themax = p_max;
      else
         themax = (thesize == 0) ? 1 : thesize;

      spx_alloc(data, themax);

      assert(isConsistent());
   }